

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_modifiers_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ModifiersTest_::
Insert<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
::TestBody(Insert<phmap::parallel_flat_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_std::mutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  pointer *__ptr;
  _func_int **message;
  char *message_00;
  tuple<const_int_&> *ptVar4;
  T val2;
  T val;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  p;
  TypeParam m;
  AssertHelper local_830;
  undefined1 local_828 [8];
  _Head_base<0UL,_const_phmap::priv::NonStandardLayout_&,_false> _Stack_820;
  undefined1 local_818 [16];
  undefined4 local_808;
  undefined4 uStack_804;
  anon_union_8_1_a8a14541_for_iterator_1 aStack_800;
  bool local_7f8;
  undefined1 local_7f0 [8];
  _Head_base<0UL,_const_phmap::priv::NonStandardLayout_&,_false> local_7e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7e0;
  AssertHelper local_7d0;
  Message local_7c8;
  undefined1 local_7c0 [8];
  long *local_7b8;
  long local_7a8 [2];
  pair<const_int,_phmap::priv::NonStandardLayout> local_798;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
  local_768;
  long lStack_730;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  local_728;
  
  hash_internal::Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void>::operator()
            (&local_798,
             (Generator<std::pair<const_int,_phmap::priv::NonStandardLayout>,_void> *)&local_728);
  lVar3 = 0x68;
  do {
    *(undefined8 *)((long)&local_768.first.inner_end_ + lVar3) = 0;
    *(undefined8 *)((long)&local_768.first.it_.ctrl_ + lVar3) = 0;
    *(undefined8 *)((long)&local_798.second.value.field_2 + lVar3 + 8) = 0;
    *(undefined8 *)((long)&local_768.first.inner_ + lVar3) = 0;
    *(undefined8 *)((long)&local_798.second.value._M_string_length + lVar3) = 0;
    *(undefined8 *)((long)&local_798.second.value.field_2 + lVar3) = 0;
    *(undefined8 *)((long)&local_798.second._vptr_NonStandardLayout + lVar3) = 0;
    *(undefined8 *)((long)&local_798.second.value._M_dataplus._M_p + lVar3) = 0;
    *(undefined8 *)((long)&local_768.first.it_.field_1 + lVar3) = 0;
    *(undefined8 *)((long)&local_768.first.it_end_.field_1 + lVar3) = 0;
    *(long *)(&local_768.second + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)&lStack_730 + lVar3) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)
     ((long)&local_728.sets_._M_elems[0].super_Lockable.super_mutex.super___mutex_base._M_mutex +
     lVar3) = 0;
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x768);
  _Stack_820._M_head_impl = &local_798.second;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)local_798.first;
  ptVar4 = (tuple<const_int_&> *)local_828;
  local_828 = (undefined1  [8])&local_798;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<phmap::priv::NonStandardLayout_const&>>
            (&local_768,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_728,&local_798.first,
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,ptVar4,
             (tuple<const_phmap::priv::NonStandardLayout_&> *)&_Stack_820);
  local_7c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_7c8.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_768.second);
  local_7c0 = (undefined1  [8])0x0;
  if (local_768.second == false) {
    testing::Message::Message((Message *)local_7f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_828,(internal *)&local_7c8,(AssertionResult *)"p.second","false",
               "true",(char *)ptVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x39,(char *)local_828);
    testing::internal::AssertHelper::operator=(&local_830,(Message *)local_7f0);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    if (local_828 != (undefined1  [8])local_818) {
      operator_delete((void *)local_828,local_818._0_8_ + 1);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_7f0 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(size_type *)local_7f0 + 8))();
    }
    if (local_7c0 != (undefined1  [8])0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_7c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0);
    }
  }
  testing::internal::
  CmpHelperEQ<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((internal *)local_828,"val","*p.first",&local_798,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_768.first.it_.field_1.slot_);
  if (local_828[0] == (internal)0x0) {
    testing::Message::Message(&local_7c8);
    if (_Stack_820._M_head_impl == (NonStandardLayout *)0x0) {
      message = (_func_int **)0x2daa0f;
    }
    else {
      message = (_func_int **)
                ((_Alloc_hider *)&(_Stack_820._M_head_impl)->_vptr_NonStandardLayout)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3a,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f0,&local_7c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f0);
    if ((long *)CONCAT44(local_7c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         (int)local_7c8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_7c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     (int)local_7c8.ss_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                          ._M_head_impl) + 8))();
    }
  }
  if (_Stack_820._M_head_impl != (NonStandardLayout *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_820,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_820._M_head_impl);
  }
  hash_internal::
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()((string *)local_7f0,
             (Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              *)&local_830);
  local_828 = (undefined1  [8])&PTR__NonStandardLayout_00345320;
  if (local_7f0 == (undefined1  [8])&local_7e0) {
    local_808 = local_7e0._8_4_;
    uStack_804 = local_7e0._12_4_;
    local_7f0 = (undefined1  [8])((long)local_818 + 8);
  }
  local_818._12_4_ = local_7e0._M_allocated_capacity._4_4_;
  local_818._8_4_ = local_7e0._M_allocated_capacity._0_4_;
  local_818._0_8_ = local_7e8._M_head_impl;
  local_7c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_798.first;
  local_7c0 = (undefined1  [8])&PTR__NonStandardLayout_00345320;
  _Stack_820._M_head_impl = (NonStandardLayout *)local_7f0;
  local_7b8 = local_7a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7b8,local_7f0,
             (ctrl_t *)((long)&(local_7e8._M_head_impl)->_vptr_NonStandardLayout + (long)local_7f0))
  ;
  local_828 = (undefined1  [8])&PTR__NonStandardLayout_00345320;
  if (_Stack_820._M_head_impl != (NonStandardLayout *)((long)local_818 + 8)) {
    operator_delete(_Stack_820._M_head_impl,(ulong)(local_818._8_8_ + 1));
  }
  local_7f0 = (undefined1  [8])&local_7c8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(int)local_7c8.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
  ptVar4 = (tuple<const_int_&> *)local_7f0;
  local_7e8._M_head_impl = (NonStandardLayout *)local_7c0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
  ::
  emplace_decomposable_with_hash<int,std::piecewise_construct_t_const&,std::tuple<int_const&>,std::tuple<phmap::priv::NonStandardLayout_const&>>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>::iterator,_bool>
              *)local_828,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>
              *)&local_728,(int *)local_7f0,
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),8) +
             SUB168(auVar2 * ZEXT816(0xde5fb9d2630458e9),0),
             (piecewise_construct_t *)&std::piecewise_construct,ptVar4,
             (tuple<const_phmap::priv::NonStandardLayout_&> *)&local_7e8);
  local_768.first.it_end_.ctrl_ = (ctrl_t *)CONCAT44(uStack_804,local_808);
  local_768.first.inner_ = (Inner *)local_828;
  local_768.first.inner_end_ = (Inner *)_Stack_820._M_head_impl;
  local_768.first.it_.ctrl_ = (ctrl_t *)local_818._0_8_;
  local_768.first.it_.field_1.slot_ = (slot_type *)local_818._8_8_;
  local_768.first.it_end_.field_1 = aStack_800;
  local_768.second = local_7f8;
  local_7f0 = (undefined1  [8])(CONCAT71(local_7f0._1_7_,local_7f8) ^ 1);
  local_7e8._M_head_impl = (NonStandardLayout *)0x0;
  if (local_7f8 != false) {
    testing::Message::Message((Message *)&local_830);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_828,(internal *)local_7f0,(AssertionResult *)"p.second","true",
               "false",(char *)ptVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3d,(char *)local_828);
    testing::internal::AssertHelper::operator=(&local_7d0,(Message *)&local_830);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (local_828 != (undefined1  [8])local_818) {
      operator_delete((void *)local_828,(ulong)(local_818._0_8_ + 1));
    }
    if (local_830.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_830.data_ + 8))();
    }
    if (local_7e8._M_head_impl != (NonStandardLayout *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_7e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_7e8._M_head_impl);
    }
  }
  testing::internal::
  CmpHelperEQ<std::pair<int_const,phmap::priv::NonStandardLayout>,std::pair<int_const,phmap::priv::NonStandardLayout>>
            ((internal *)local_828,"val","*p.first",&local_798,
             (pair<const_int,_phmap::priv::NonStandardLayout> *)local_768.first.it_.field_1.slot_);
  if (local_828[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_7f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Stack_820._M_head_impl ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      message_00 = "";
    }
    else {
      message_00 = (char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)&(_Stack_820._M_head_impl)->_vptr_NonStandardLayout)->
                           _M_allocated_capacity;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_modifiers_test.h"
               ,0x3e,message_00);
    testing::internal::AssertHelper::operator=(&local_830,(Message *)local_7f0);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    if (local_7f0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_7f0 + 8))();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_820._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_820,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_820._M_head_impl);
  }
  local_7c0 = (undefined1  [8])&PTR__NonStandardLayout_00345320;
  if (local_7b8 != local_7a8) {
    operator_delete(local_7b8,local_7a8[0] + 1);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::~parallel_hash_set(&local_728);
  local_798.second._vptr_NonStandardLayout = (_func_int **)&PTR__NonStandardLayout_00345320;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798.second.value._M_dataplus._M_p != &local_798.second.value.field_2) {
    operator_delete(local_798.second.value._M_dataplus._M_p,
                    local_798.second.value.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TYPED_TEST_P(ModifiersTest, Insert) {
  using T = hash_internal::GeneratedType<TypeParam>;
  using V = typename TypeParam::mapped_type;
  T val = hash_internal::Generator<T>()();
  TypeParam m;
  auto p = m.insert(val);
  EXPECT_TRUE(p.second);
  EXPECT_EQ(val, *p.first);
  T val2 = {val.first, hash_internal::Generator<V>()()};
  p = m.insert(val2);
  EXPECT_FALSE(p.second);
  EXPECT_EQ(val, *p.first);
}